

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_echocli.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  stCoEpoll_t *ctx;
  stCoRoutine_t *co;
  stEndPoint endpoint;
  sigaction sa;
  stCoRoutine_t *local_d8;
  char *local_d0;
  undefined2 local_c8;
  _union_1457 local_c0 [19];
  
  local_d0 = argv[1];
  iVar1 = atoi(argv[2]);
  local_c8 = (undefined2)iVar1;
  iVar1 = atoi(argv[3]);
  iVar2 = atoi(argv[4]);
  local_c0[0] = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)local_c0,(sigaction *)0x0);
  if (0 < iVar2) {
    do {
      _Var3 = fork();
      if (_Var3 < 1) {
        if (_Var3 < 0) {
          return 0;
        }
        if (0 < iVar1) {
          do {
            local_d8 = (stCoRoutine_t *)0x0;
            co_create(&local_d8,(stCoRoutineAttr_t *)0x0,readwrite_routine,&local_d0);
            co_resume(local_d8);
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
        ctx = co_get_epoll_ct();
        co_eventloop(ctx,(pfn_co_eventloop_t)0x0,(void *)0x0);
        exit(0);
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return 0;
}

Assistant:

int main(int argc,char *argv[])
{
	stEndPoint endpoint;
	endpoint.ip = argv[1];
	endpoint.port = atoi(argv[2]);
	int cnt = atoi( argv[3] );
	int proccnt = atoi( argv[4] );
	
	struct sigaction sa;
	sa.sa_handler = SIG_IGN;
	sigaction( SIGPIPE, &sa, NULL );
	
	for(int k=0;k<proccnt;k++)
	{

		pid_t pid = fork();
		if( pid > 0 )
		{
			continue;
		}
		else if( pid < 0 )
		{
			break;
		}
		for(int i=0;i<cnt;i++)
		{
			stCoRoutine_t *co = 0;
			co_create( &co,NULL,readwrite_routine, &endpoint);
			co_resume( co );
		}
		co_eventloop( co_get_epoll_ct(),0,0 );

		exit(0);
	}
	return 0;
}